

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NS_getForce.cpp
# Opt level: O1

void __thiscall
NavierStokesBase::getForce
          (NavierStokesBase *this,FArrayBox *force,Box *bx,int scomp,int ncomp,Real time,
          FArrayBox *State,FArrayBox *Aux,int auxScomp,MFIter *param_9)

{
  Box *pBVar1;
  Box *subbox;
  ostringstream *poVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  double *pdVar12;
  char cVar13;
  long lVar14;
  DestComp dcomp;
  long lVar15;
  int iVar16;
  double *pdVar17;
  NumComps ncomp_00;
  long lVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  int iVar23;
  long lVar24;
  bool bVar25;
  double dVar26;
  Print local_228;
  ulong local_a0;
  long local_98;
  long local_90;
  long local_88;
  long local_80;
  long local_78;
  long local_70;
  long local_68;
  long local_60;
  double *local_58;
  long local_50;
  Real local_48;
  undefined8 uStack_40;
  
  amrex::BaseFab<double>::dataPtr(&State->super_BaseFab<double>,0);
  amrex::BaseFab<double>::dataPtr(&Aux->super_BaseFab<double>,auxScomp);
  local_48 = gravity;
  uStack_40 = 0;
  if ((*(int *)(amrex::ParallelContext::frames + 0xc) != 0) || (getForceVerbose == 0))
  goto LAB_00256b7f;
  local_228.os = amrex::OutStream();
  poVar2 = &local_228.ss;
  local_228.comm = *(MPI_Comm *)(DAT_00756620 + -0x48);
  local_228.rank = *(int *)(DAT_00756620 + -0x30);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar2);
  *(undefined8 *)(&local_228.field_0x18 + *(long *)(local_228._16_8_ + -0x18)) =
       *(undefined8 *)(local_228.os + *(long *)(*(long *)local_228.os + -0x18) + 8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar2,"NavierStokesBase::getForce(): Entered...",0x28);
  cVar13 = (char)poVar2;
  std::ios::widen((char)*(undefined8 *)(local_228._16_8_ + -0x18) + cVar13);
  std::ostream::put(cVar13);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"time      = ",0xc);
  std::ostream::_M_insert<double>(time);
  std::ios::widen((char)*(undefined8 *)(local_228._16_8_ + -0x18) + cVar13);
  std::ostream::put(cVar13);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"scomp     = ",0xc);
  std::ostream::operator<<(poVar2,scomp);
  std::ios::widen((char)*(undefined8 *)(local_228._16_8_ + -0x18) + cVar13);
  std::ostream::put(cVar13);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"ncomp     = ",0xc);
  std::ostream::operator<<(poVar2,ncomp);
  std::ios::widen((char)*(undefined8 *)(local_228._16_8_ + -0x18) + cVar13);
  std::ostream::put(cVar13);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"auxScomp = ",0xb);
  std::ostream::operator<<(poVar2,auxScomp);
  std::ios::widen((char)*(undefined8 *)(local_228._16_8_ + -0x18) + cVar13);
  std::ostream::put(cVar13);
  std::ostream::flush();
  amrex::Print::~Print(&local_228);
  if (ncomp == 1) {
    local_228.os = amrex::OutStream();
    local_228.comm = *(MPI_Comm *)(DAT_00756620 + -0x48);
    local_228.rank = *(int *)(DAT_00756620 + -0x30);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar2);
    *(undefined8 *)(&local_228.field_0x18 + *(long *)(local_228._16_8_ + -0x18)) =
         *(undefined8 *)(local_228.os + *(long *)(*(long *)local_228.os + -0x18) + 8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar2,"Doing only component ",0x15);
    std::ostream::operator<<(poVar2,scomp);
    std::ios::widen((char)*(undefined8 *)(local_228._16_8_ + -0x18) + cVar13);
    std::ostream::put(cVar13);
    std::ostream::flush();
LAB_00256259:
    amrex::Print::~Print(&local_228);
  }
  else {
    if (ncomp == 3 && scomp == 0) {
      local_228.os = amrex::OutStream();
      local_228.comm = *(MPI_Comm *)(DAT_00756620 + -0x48);
      local_228.rank = *(int *)(DAT_00756620 + -0x30);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar2);
      *(undefined8 *)(&local_228.field_0x18 + *(long *)(local_228._16_8_ + -0x18)) =
           *(undefined8 *)(local_228.os + *(long *)(*(long *)local_228.os + -0x18) + 8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar2,"Doing velocities only",0x15);
      std::ios::widen((char)*(undefined8 *)(local_228._16_8_ + -0x18) + cVar13);
      std::ostream::put(cVar13);
      std::ostream::flush();
      goto LAB_00256259;
    }
    if (2 < scomp) {
      local_228.os = amrex::OutStream();
      local_228.comm = *(MPI_Comm *)(DAT_00756620 + -0x48);
      local_228.rank = *(int *)(DAT_00756620 + -0x30);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar2);
      *(undefined8 *)(&local_228.field_0x18 + *(long *)(local_228._16_8_ + -0x18)) =
           *(undefined8 *)(local_228.os + *(long *)(*(long *)local_228.os + -0x18) + 8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"Doing ",6);
      std::ostream::operator<<(poVar2,ncomp);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar2," component(s) starting with component ",0x26);
      std::ostream::operator<<(poVar2,scomp);
      std::ios::widen((char)*(undefined8 *)(local_228._16_8_ + -0x18) + cVar13);
      std::ostream::put(cVar13);
      std::ostream::flush();
      goto LAB_00256259;
    }
  }
  local_228.os = amrex::OutStream();
  local_228.comm = *(MPI_Comm *)(DAT_00756620 + -0x48);
  local_228.rank = *(int *)(DAT_00756620 + -0x30);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar2);
  *(undefined8 *)(&local_228.field_0x18 + *(long *)(local_228._16_8_ + -0x18)) =
       *(undefined8 *)(local_228.os + *(long *)(*(long *)local_228.os + -0x18) + 8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar2,"NavierStokesBase::getForce(): Filling Force on box:",0x33);
  amrex::operator<<((ostream *)poVar2,bx);
  std::ios::widen((char)*(undefined8 *)(local_228._16_8_ + -0x18) + cVar13);
  std::ostream::put(cVar13);
  std::ostream::flush();
  amrex::Print::~Print(&local_228);
  local_228.os = amrex::OutStream();
  local_228.comm = *(MPI_Comm *)(DAT_00756620 + -0x48);
  local_228.rank = *(int *)(DAT_00756620 + -0x30);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar2);
  *(undefined8 *)(&local_228.field_0x18 + *(long *)(local_228._16_8_ + -0x18)) =
       *(undefined8 *)(local_228.os + *(long *)(*(long *)local_228.os + -0x18) + 8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar2,"NavierStokesBase::getForce(): Force Domain:",0x2b);
  std::ios::widen((char)*(undefined8 *)(local_228._16_8_ + -0x18) + cVar13);
  std::ostream::put(cVar13);
  std::ostream::flush();
  amrex::Print::~Print(&local_228);
  local_228.os = amrex::OutStream();
  local_228.comm = *(MPI_Comm *)(DAT_00756620 + -0x48);
  local_228.rank = *(int *)(DAT_00756620 + -0x30);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar2);
  *(undefined8 *)(&local_228.field_0x18 + *(long *)(local_228._16_8_ + -0x18)) =
       *(undefined8 *)(local_228.os + *(long *)(*(long *)local_228.os + -0x18) + 8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"(",1);
  std::ostream::operator<<(poVar2,(force->super_BaseFab<double>).domain.smallend.vect[0]);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,",",1);
  std::ostream::operator<<(poVar2,(force->super_BaseFab<double>).domain.smallend.vect[1]);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,",",1);
  std::ostream::operator<<(poVar2,(force->super_BaseFab<double>).domain.smallend.vect[2]);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,") - ",4);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"(",1);
  std::ostream::operator<<(poVar2,(force->super_BaseFab<double>).domain.bigend.vect[0]);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,",",1);
  std::ostream::operator<<(poVar2,(force->super_BaseFab<double>).domain.bigend.vect[1]);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,",",1);
  std::ostream::operator<<(poVar2,(force->super_BaseFab<double>).domain.bigend.vect[2]);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,")",1);
  std::ios::widen((char)*(undefined8 *)(local_228._16_8_ + -0x18) + cVar13);
  std::ostream::put(cVar13);
  std::ostream::flush();
  amrex::Print::~Print(&local_228);
  local_228.os = amrex::OutStream();
  local_228.comm = *(MPI_Comm *)(DAT_00756620 + -0x48);
  local_228.rank = *(int *)(DAT_00756620 + -0x30);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar2);
  *(undefined8 *)(&local_228.field_0x18 + *(long *)(local_228._16_8_ + -0x18)) =
       *(undefined8 *)(local_228.os + *(long *)(*(long *)local_228.os + -0x18) + 8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar2,"NavierStokesBase::getForce(): Vel Domain:",0x29);
  std::ios::widen((char)*(undefined8 *)(local_228._16_8_ + -0x18) + cVar13);
  std::ostream::put(cVar13);
  std::ostream::flush();
  amrex::Print::~Print(&local_228);
  local_228.os = amrex::OutStream();
  local_228.comm = *(MPI_Comm *)(DAT_00756620 + -0x48);
  local_228.rank = *(int *)(DAT_00756620 + -0x30);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar2);
  *(undefined8 *)(&local_228.field_0x18 + *(long *)(local_228._16_8_ + -0x18)) =
       *(undefined8 *)(local_228.os + *(long *)(*(long *)local_228.os + -0x18) + 8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"(",1);
  pBVar1 = &(State->super_BaseFab<double>).domain;
  std::ostream::operator<<(poVar2,(pBVar1->smallend).vect[0]);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,",",1);
  std::ostream::operator<<(poVar2,(State->super_BaseFab<double>).domain.smallend.vect[1]);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,",",1);
  std::ostream::operator<<(poVar2,(State->super_BaseFab<double>).domain.smallend.vect[2]);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,") - ",4);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"(",1);
  std::ostream::operator<<(poVar2,(State->super_BaseFab<double>).domain.bigend.vect[0]);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,",",1);
  std::ostream::operator<<(poVar2,(State->super_BaseFab<double>).domain.bigend.vect[1]);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,",",1);
  std::ostream::operator<<(poVar2,(State->super_BaseFab<double>).domain.bigend.vect[2]);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,")",1);
  std::ios::widen((char)*(undefined8 *)(local_228._16_8_ + -0x18) + cVar13);
  std::ostream::put(cVar13);
  std::ostream::flush();
  amrex::Print::~Print(&local_228);
  local_228.os = amrex::OutStream();
  local_228.comm = *(MPI_Comm *)(DAT_00756620 + -0x48);
  local_228.rank = *(int *)(DAT_00756620 + -0x30);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar2);
  *(undefined8 *)(&local_228.field_0x18 + *(long *)(local_228._16_8_ + -0x18)) =
       *(undefined8 *)(local_228.os + *(long *)(*(long *)local_228.os + -0x18) + 8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar2,"NavierStokesBase::getForce(): Scal Domain:",0x2a);
  std::ios::widen((char)*(undefined8 *)(local_228._16_8_ + -0x18) + cVar13);
  std::ostream::put(cVar13);
  std::ostream::flush();
  amrex::Print::~Print(&local_228);
  local_228.os = amrex::OutStream();
  local_228.comm = *(MPI_Comm *)(DAT_00756620 + -0x48);
  local_228.rank = *(int *)(DAT_00756620 + -0x30);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar2);
  *(undefined8 *)(&local_228.field_0x18 + *(long *)(local_228._16_8_ + -0x18)) =
       *(undefined8 *)(local_228.os + *(long *)(*(long *)local_228.os + -0x18) + 8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"(",1);
  subbox = &(Aux->super_BaseFab<double>).domain;
  std::ostream::operator<<(poVar2,(subbox->smallend).vect[0]);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,",",1);
  std::ostream::operator<<(poVar2,(Aux->super_BaseFab<double>).domain.smallend.vect[1]);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,",",1);
  std::ostream::operator<<(poVar2,(Aux->super_BaseFab<double>).domain.smallend.vect[2]);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,") - ",4);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"(",1);
  std::ostream::operator<<(poVar2,(Aux->super_BaseFab<double>).domain.bigend.vect[0]);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,",",1);
  std::ostream::operator<<(poVar2,(Aux->super_BaseFab<double>).domain.bigend.vect[1]);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,",",1);
  std::ostream::operator<<(poVar2,(Aux->super_BaseFab<double>).domain.bigend.vect[2]);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,")",1);
  std::ios::widen((char)*(undefined8 *)(local_228._16_8_ + -0x18) + cVar13);
  std::ostream::put(cVar13);
  std::ostream::flush();
  amrex::Print::~Print(&local_228);
  iVar23 = scomp;
  iVar16 = ncomp;
  if (0 < ncomp) {
    do {
      local_228.os = amrex::OutStream();
      local_228.comm = *(MPI_Comm *)(DAT_00756620 + -0x48);
      local_228.rank = *(int *)(DAT_00756620 + -0x30);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar2);
      *(undefined8 *)(&local_228.field_0x18 + *(long *)(local_228._16_8_ + -0x18)) =
           *(undefined8 *)(local_228.os + *(long *)(*(long *)local_228.os + -0x18) + 8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"State comp ",0xb);
      std::ostream::operator<<(poVar2,iVar23);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2," min/max ",9);
      dVar26 = amrex::BaseFab<double>::min<(amrex::RunOn)0>
                         (&State->super_BaseFab<double>,pBVar1,iVar23);
      std::ostream::_M_insert<double>(dVar26);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2," / ",3);
      dVar26 = amrex::BaseFab<double>::max<(amrex::RunOn)0>
                         (&State->super_BaseFab<double>,pBVar1,iVar23);
      std::ostream::_M_insert<double>(dVar26);
      std::ios::widen((char)*(undefined8 *)(local_228._16_8_ + -0x18) + cVar13);
      std::ostream::put(cVar13);
      std::ostream::flush();
      amrex::Print::~Print(&local_228);
      iVar16 = iVar16 + -1;
      iVar23 = iVar23 + 1;
    } while (iVar16 != 0);
  }
  if (auxScomp < (Aux->super_BaseFab<double>).nvar) {
    iVar23 = auxScomp;
    do {
      local_228.os = amrex::OutStream();
      local_228.comm = *(MPI_Comm *)(DAT_00756620 + -0x48);
      local_228.rank = *(int *)(DAT_00756620 + -0x30);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar2);
      *(undefined8 *)(&local_228.field_0x18 + *(long *)(local_228._16_8_ + -0x18)) =
           *(undefined8 *)(local_228.os + *(long *)(*(long *)local_228.os + -0x18) + 8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"aux comp ",9);
      std::ostream::operator<<(poVar2,iVar23);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2," min/max ",9);
      dVar26 = amrex::BaseFab<double>::min<(amrex::RunOn)0>
                         (&Aux->super_BaseFab<double>,subbox,iVar23);
      std::ostream::_M_insert<double>(dVar26);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2," / ",3);
      dVar26 = amrex::BaseFab<double>::max<(amrex::RunOn)0>
                         (&Aux->super_BaseFab<double>,subbox,iVar23);
      std::ostream::_M_insert<double>(dVar26);
      std::ios::widen((char)*(undefined8 *)(local_228._16_8_ + -0x18) + cVar13);
      std::ostream::put(cVar13);
      std::ostream::flush();
      amrex::Print::~Print(&local_228);
      iVar23 = iVar23 + 1;
    } while (iVar23 < (Aux->super_BaseFab<double>).nvar);
  }
LAB_00256b7f:
  if (scomp < 3) {
    if (scomp != 0) {
      amrex::Assert_host("scomp==Xvel",
                         "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/IAMR/Source/NS_getForce.cpp"
                         ,0x7c,(char *)0x0);
    }
    if (ncomp < 3) {
      amrex::Assert_host("ncomp>=AMREX_SPACEDIM",
                         "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/IAMR/Source/NS_getForce.cpp"
                         ,0x7d,(char *)0x0);
    }
  }
  if (scomp == 0) {
    if (ABS(local_48) <= 0.0001) {
      local_228.rank = 0;
      local_228.comm = 0;
      amrex::BaseFab<double>::setVal<(amrex::RunOn)0>
                (&force->super_BaseFab<double>,(double *)&local_228,bx,(DestComp)0x0,(NumComps)0x3);
    }
    else {
      iVar23 = (bx->smallend).vect[2];
      iVar16 = (bx->bigend).vect[2];
      if (iVar23 <= iVar16) {
        iVar3 = (force->super_BaseFab<double>).domain.smallend.vect[0];
        iVar4 = (force->super_BaseFab<double>).domain.smallend.vect[1];
        iVar5 = (force->super_BaseFab<double>).domain.smallend.vect[2];
        local_70 = (long)iVar5;
        iVar6 = (Aux->super_BaseFab<double>).domain.smallend.vect[0];
        iVar7 = (Aux->super_BaseFab<double>).domain.smallend.vect[1];
        iVar8 = (Aux->super_BaseFab<double>).domain.smallend.vect[2];
        iVar9 = (bx->smallend).vect[1];
        iVar10 = (bx->smallend).vect[0];
        local_58 = (Aux->super_BaseFab<double>).dptr + ((long)iVar10 - (long)iVar6);
        local_60 = (long)iVar9 * 8;
        local_68 = local_60 + (long)iVar7 * -8;
        local_50 = (long)auxScomp *
                   (long)(((Aux->super_BaseFab<double>).domain.bigend.vect[2] - iVar8) + 1) * 8 +
                   (long)iVar8 * -8;
        lVar20 = (long)(((force->super_BaseFab<double>).domain.bigend.vect[2] - iVar5) + 1);
        lVar14 = (long)iVar10 * 8 + (long)iVar3 * -8;
        local_60 = local_60 + (long)iVar4 * -8;
        local_88 = (long)(((force->super_BaseFab<double>).domain.bigend.vect[0] - iVar3) + 1);
        lVar15 = (long)(((force->super_BaseFab<double>).domain.bigend.vect[1] - iVar4) + 1);
        local_90 = (long)(((Aux->super_BaseFab<double>).domain.bigend.vect[0] - iVar6) + 1);
        local_98 = (long)(((Aux->super_BaseFab<double>).domain.bigend.vect[1] - iVar7) + 1);
        local_78 = lVar20 * 0x10 + local_70 * -8;
        local_80 = lVar20 * 8 + local_70 * -8;
        local_70 = local_70 * -8;
        iVar3 = (bx->bigend).vect[0];
        pdVar12 = (force->super_BaseFab<double>).dptr;
        uVar11 = (bx->bigend).vect[1];
        local_a0 = (ulong)uVar11;
        lVar20 = local_88 * 8;
        do {
          if (iVar9 <= (int)uVar11) {
            lVar18 = (long)iVar23;
            pdVar17 = (double *)
                      (((local_50 + lVar18 * 8) * local_98 + local_68) * local_90 + (long)local_58);
            lVar22 = (long)pdVar12 +
                     ((local_78 + lVar18 * 8) * lVar15 + local_60) * local_88 + lVar14;
            lVar21 = (long)pdVar12 +
                     ((local_80 + lVar18 * 8) * lVar15 + local_60) * local_88 + lVar14;
            lVar19 = (long)pdVar12 +
                     ((local_70 + lVar18 * 8) * lVar15 + local_60) * local_88 + lVar14;
            lVar18 = (long)iVar9;
            do {
              if (iVar10 <= iVar3) {
                lVar24 = 0;
                do {
                  *(undefined8 *)(lVar19 + lVar24 * 8) = 0;
                  *(undefined8 *)(lVar21 + lVar24 * 8) = 0;
                  *(double *)(lVar22 + lVar24 * 8) = pdVar17[lVar24] * local_48;
                  lVar24 = lVar24 + 1;
                } while ((iVar3 - iVar10) + 1 != (int)lVar24);
              }
              lVar18 = lVar18 + 1;
              pdVar17 = pdVar17 + local_90;
              lVar22 = lVar22 + lVar20;
              lVar21 = lVar21 + lVar20;
              lVar19 = lVar19 + lVar20;
            } while (uVar11 + 1 != (int)lVar18);
          }
          bVar25 = iVar23 != iVar16;
          iVar23 = iVar23 + 1;
        } while (bVar25);
      }
    }
  }
  dcomp.i = 0;
  ncomp_00.n = ncomp;
  if (scomp < 3) {
    dcomp.i = (uint)(3 < scomp + ncomp) * 4 + -1;
    ncomp_00.n = -1;
    if (3 < scomp + ncomp) {
      ncomp_00.n = ncomp + -3;
    }
  }
  if (0 < ncomp_00.n) {
    local_228.rank = 0;
    local_228.comm = 0;
    amrex::BaseFab<double>::setVal<(amrex::RunOn)0>
              (&force->super_BaseFab<double>,(double *)&local_228,bx,dcomp,ncomp_00);
  }
  if ((*(int *)(amrex::ParallelContext::frames + 0xc) == 0) && (getForceVerbose != 0)) {
    poVar2 = &local_228.ss;
    cVar13 = (char)poVar2;
    if (0 < ncomp) {
      pBVar1 = &(force->super_BaseFab<double>).domain;
      do {
        local_228.os = amrex::OutStream();
        local_228.comm = *(MPI_Comm *)(DAT_00756620 + -0x48);
        local_228.rank = *(int *)(DAT_00756620 + -0x30);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar2);
        *(undefined8 *)(&local_228.field_0x18 + *(long *)(local_228._16_8_ + -0x18)) =
             *(undefined8 *)(local_228.os + *(long *)(*(long *)local_228.os + -0x18) + 8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"Force comp ",0xb);
        std::ostream::operator<<(poVar2,scomp);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2," min/max ",9);
        dVar26 = amrex::BaseFab<double>::min<(amrex::RunOn)0>
                           (&force->super_BaseFab<double>,pBVar1,scomp);
        std::ostream::_M_insert<double>(dVar26);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2," / ",3);
        dVar26 = amrex::BaseFab<double>::max<(amrex::RunOn)0>
                           (&force->super_BaseFab<double>,pBVar1,scomp);
        std::ostream::_M_insert<double>(dVar26);
        std::ios::widen((char)*(undefined8 *)(local_228._16_8_ + -0x18) + cVar13);
        std::ostream::put(cVar13);
        std::ostream::flush();
        amrex::Print::~Print(&local_228);
        scomp = scomp + 1;
        ncomp = ncomp + -1;
      } while (ncomp != 0);
    }
    local_228.os = amrex::OutStream();
    local_228.comm = *(MPI_Comm *)(DAT_00756620 + -0x48);
    local_228.rank = *(int *)(DAT_00756620 + -0x30);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar2);
    *(undefined8 *)(&local_228.field_0x18 + *(long *)(local_228._16_8_ + -0x18)) =
         *(undefined8 *)(local_228.os + *(long *)(*(long *)local_228.os + -0x18) + 8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar2,"NavierStokesBase::getForce(): Leaving...",0x28);
    std::ios::widen((char)*(undefined8 *)(local_228._16_8_ + -0x18) + cVar13);
    std::ostream::put(cVar13);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"---",3);
    std::ios::widen((char)*(undefined8 *)(local_228._16_8_ + -0x18) + cVar13);
    std::ostream::put(cVar13);
    std::ostream::flush();
    amrex::Print::~Print(&local_228);
  }
  return;
}

Assistant:

void
NavierStokesBase::getForce (FArrayBox&       force,
                            const Box&       bx,
                            int              scomp,
                            int              ncomp,
                            const Real       time,
                            const FArrayBox& State,
                            const FArrayBox& Aux,
                            int              auxScomp,
                            const MFIter&    /*mfi*/)
{

   const Real* StateDataPtr  = State.dataPtr();
   const Real* auxDataPtr = Aux.dataPtr(auxScomp);

   const Real  grav     = gravity;

   if (ParallelDescriptor::IOProcessor() && getForceVerbose)
   {
       const int*  f_lo     = force.loVect();
       const int*  f_hi     = force.hiVect();
       const int*  v_lo     = State.loVect();
       const int*  v_hi     = State.hiVect();
       const int*  s_lo     = Aux.loVect();
       const int*  s_hi     = Aux.hiVect();
       
       amrex::Print() << "NavierStokesBase::getForce(): Entered..." << std::endl 
		      << "time      = " << time << std::endl
		      << "scomp     = " << scomp << std::endl
		      << "ncomp     = " << ncomp << std::endl
		      << "auxScomp = " << auxScomp << std::endl;
       
       if  (ncomp==1) amrex::Print() << "Doing only component " << scomp << std::endl;
       else if (scomp==0 && ncomp==AMREX_SPACEDIM) amrex::Print() << "Doing velocities only" << std::endl;
       else if (scomp>=AMREX_SPACEDIM) amrex::Print() << "Doing " << ncomp << " component(s) starting with component " << scomp << std::endl;

       amrex::Print() << "NavierStokesBase::getForce(): Filling Force on box:"
		      << bx << std::endl;
#if (AMREX_SPACEDIM == 3)
       amrex::Print() << "NavierStokesBase::getForce(): Force Domain:" << std::endl;
       amrex::Print() << "(" << f_lo[0] << "," << f_lo[1] << "," << f_lo[2] << ") - "
		      << "(" << f_hi[0] << "," << f_hi[1] << "," << f_hi[2] << ")" << std::endl;
       amrex::Print() << "NavierStokesBase::getForce(): Vel Domain:" << std::endl;
       amrex::Print() << "(" << v_lo[0] << "," << v_lo[1] << "," << v_lo[2] << ") - "
		      << "(" << v_hi[0] << "," << v_hi[1] << "," << v_hi[2] << ")" << std::endl;
       amrex::Print() << "NavierStokesBase::getForce(): Scal Domain:" << std::endl;
       amrex::Print() << "(" << s_lo[0] << "," << s_lo[1] << "," << s_lo[2] << ") - "
		      << "(" << s_hi[0] << "," << s_hi[1] << "," << s_hi[2] << ")" << std::endl;
#else
       amrex::Print() << "NavierStokesBase::getForce(): Force Domain:" << std::endl;
       amrex::Print() << "(" << f_lo[0] << "," << f_lo[1] << ") - "
		      << "(" << f_hi[0] << "," << f_hi[1] << ")" << std::endl;
       amrex::Print() << "NavierStokesBase::getForce(): State Domain:" << std::endl;
       amrex::Print() << "(" << v_lo[0] << "," << v_lo[1] << ") - "
		      << "(" << v_hi[0] << "," << v_hi[1] << ")" << std::endl;
       amrex::Print() << "NavierStokesBase::getForce(): Aux Domain:" << std::endl;
       amrex::Print() << "(" << s_lo[0] << "," << s_lo[1] << ") - "
		      << "(" << s_hi[0] << "," << s_hi[1] << ")" << std::endl;
#endif

       // Compute min/max
       Real min, max;
       for (int n=0; n<ncomp; n++) {
	   min= 1.e234;
	   max=-1.e234;
	   amrex::Print() << "State comp " << scomp+n << " min/max " 
			  << State.min<RunOn::Gpu>(scomp+n) << " / "
			  << State.max<RunOn::Gpu>(scomp+n) << std::endl;
       }
       for (int n=auxScomp; n<Aux.nComp(); n++) {
	   min= 1.e234;
	   max=-1.e234;
	   amrex::Print() << "aux comp " << n << " min/max " 
			  << Aux.min<RunOn::Gpu>(n) << " / "
			  << Aux.max<RunOn::Gpu>(n) << std::endl;
       }
   } //end if(getForceVerbose)

   //
   // Here's the meat
   //
   // Velocity forcing
   //
   if ( scomp<AMREX_SPACEDIM ){
       AMREX_ALWAYS_ASSERT(scomp==Xvel);
       AMREX_ALWAYS_ASSERT(ncomp>=AMREX_SPACEDIM);
   }

   if ( scomp==Xvel ){
     //
     // TODO: add some switch for user-supplied/problem-dependent forcing
     //
     auto const& frc = force.array(scomp);
     auto const& aux = Aux.array(auxScomp);

     if ( std::abs(grav) > 0.0001) {
       amrex::ParallelFor(bx, [frc, aux, grav]
       AMREX_GPU_DEVICE(int i, int j, int k) noexcept
       {
	 frc(i,j,k,0) = Real(0.0);
#if ( AMREX_SPACEDIM == 2 )
         frc(i,j,k,1) = grav*aux(i,j,k,0);
#elif ( AMREX_SPACEDIM == 3 )
         frc(i,j,k,1) = Real(0.0);
         frc(i,j,k,2) = grav*aux(i,j,k,0);
#endif
       });
     }
     else {
       force.setVal<RunOn::Gpu>(0.0, bx, Xvel, AMREX_SPACEDIM);
     }
   }

   //
   // Scalar forcing
   //
   // During a regular timestep, getForce is called on scalars only.
   // During the multilevel sync, scalars are done with velocity.
   //
   int scomp_scal = -1;
   int ncomp_scal = -1;
   if ( scomp >= AMREX_SPACEDIM ) {
       // Doing only scalars
       scomp_scal = 0;
       ncomp_scal = ncomp;
   }
   // Recall that we will only get here if previous block is false,
   // i.e. if scomp < AMREX_SPACEDIM
   else if ( scomp+ncomp > AMREX_SPACEDIM) {
       // Doing scalars with vel
       scomp_scal = Density;
       ncomp_scal = ncomp-Density;
   }

   if (ncomp_scal > 0) {
       force.setVal<RunOn::Gpu>(0.0, bx, scomp_scal, ncomp_scal);
       //
       // Or create user-defined forcing.
       // Recall we compute a density-weighted forcing term.
       //
       // auto const& frc  = force.array(scomp_scal);
       // amrex::ParallelFor(bx, ncomp_scal, [frc]
       // AMREX_GPU_DEVICE(int i, int j, int k, int n) noexcept
       // {
       //          frc(i,j,k,n) = ;
       //          frc(i,j,k,n) *= rho;
       // });
   }
     
   if (ParallelDescriptor::IOProcessor() && getForceVerbose) {
       // Compute min/max
       Real min, max;
       for (int n=0; n<ncomp; n++) {
	   min= 1.e234;
	   max=-1.e234;
	   amrex::Print() << "Force comp " << scomp+n << " min/max " 
			  << force.min<RunOn::Gpu>(scomp+n) << " / "
			  << force.max<RunOn::Gpu>(scomp+n) << std::endl;
       }

      amrex::Print() << "NavierStokesBase::getForce(): Leaving..." 
                     << std::endl << "---" << std::endl;
   }
}